

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

int resampler_run_sinc(resampler *r,float **out_,float *out_end)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  float *pfVar8;
  float *in_RDX;
  long *in_RSI;
  int *in_RDI;
  int window_step;
  int step;
  bigint phase_inc;
  bigint phase;
  float *in_end;
  float *in;
  float *out;
  int used;
  float *in_;
  int in_size;
  int local_194;
  float local_18c;
  float local_180;
  int local_174;
  double local_170;
  double adStack_168 [31];
  int window_pos;
  int pos;
  float sample;
  int phase_adj;
  int phase_reduced;
  int i;
  double kernel_sum;
  ulong local_50;
  int *local_40;
  float *local_38;
  int local_2c;
  
  iVar3 = in_RDI[1];
  piVar7 = in_RDI + (long)*in_RDI + (0x52 - (long)in_RDI[1]);
  local_2c = 0;
  if (0 < iVar3 + -0x20) {
    local_38 = (float *)*in_RSI;
    local_50 = *(ulong *)(in_RDI + 4);
    uVar4 = *(ulong *)(in_RDI + 6);
    local_40 = piVar7;
    if (uVar4 < 0x100000001) {
      local_194 = 0x3fe;
    }
    else {
      local_18c = (float)uVar4;
      local_194 = (int)((1024.0 / (local_18c * 2.3283064e-10)) * 0.999);
    }
    do {
      local_170 = 0.0;
      local_174 = 0x10;
      iVar5 = (int)(local_50 >> 0x16);
      if (in_RDX <= local_38) break;
      for (; -0x10 < local_174; local_174 = local_174 + -1) {
        iVar6 = (iVar5 * local_194) / 0x400 - local_174 * local_194;
        if (iVar6 < 1) {
          iVar6 = -iVar6;
        }
        fVar1 = sinc_lut[iVar6];
        iVar6 = iVar5 + local_174 * -0x400;
        if (iVar6 < 1) {
          iVar6 = -iVar6;
        }
        fVar2 = window_lut[iVar6];
        adStack_168[local_174 + 0xf] = (double)(fVar1 * fVar2);
        local_170 = (double)(fVar1 * fVar2) + local_170;
      }
      local_180 = 0.0;
      for (local_174 = 0; local_174 < 0x20; local_174 = local_174 + 1) {
        local_180 = (float)((double)(float)local_40[local_174] * adStack_168[local_174]) + local_180
        ;
      }
      pfVar8 = local_38 + 1;
      *local_38 = (float)((double)local_180 / local_170);
      local_40 = local_40 + (uVar4 + local_50 >> 0x20);
      local_50 = uVar4 + local_50 & 0xffffffff;
      local_38 = pfVar8;
    } while (local_40 < piVar7 + (iVar3 + -0x20));
    *(ulong *)(in_RDI + 4) = local_50;
    *in_RSI = (long)local_38;
    local_2c = (int)((long)local_40 - (long)piVar7 >> 2);
    in_RDI[1] = in_RDI[1] - local_2c;
  }
  return local_2c;
}

Assistant:

static int resampler_run_sinc(resampler * r, float ** out_, float * out_end)
{
    int in_size = r->write_filled;
    float const* in_ = r->buffer_in + resampler_buffer_size + r->write_pos - r->write_filled;
    int used = 0;
    in_size -= SINC_WIDTH * 2;
    if ( in_size > 0 )
    {
        float* out = *out_;
        float const* in = in_;
        float const* const in_end = in + in_size;
        bigint phase = r->phase;
        bigint phase_inc = r->phase_inc;

        int step = phase_inc.quad > 0x100000000ll ?
			(int)(RESAMPLER_RESOLUTION / (phase_inc.quad * (1.f / 0x100000000ll)) * RESAMPLER_SINC_CUTOFF) :
			(int)(RESAMPLER_RESOLUTION * RESAMPLER_SINC_CUTOFF);
        int window_step = RESAMPLER_RESOLUTION;

        do
        {
            double kernel[SINC_WIDTH * 2], kernel_sum = 0.0;
            int i = SINC_WIDTH;
            int phase_reduced = PHASE_REDUCE(phase);
            int phase_adj = phase_reduced * step / RESAMPLER_RESOLUTION;
            float sample;

            if ( out >= out_end )
                break;

            for (; i >= -SINC_WIDTH + 1; --i)
            {
                int pos = i * step;
                int window_pos = i * window_step;
                kernel_sum += kernel[i + SINC_WIDTH - 1] = sinc_lut[abs(phase_adj - pos)] * window_lut[abs(phase_reduced - window_pos)];
            }
            for (sample = 0, i = 0; i < SINC_WIDTH * 2; ++i)
                sample += (float)(in[i] * kernel[i]);
            *out++ = (float)(sample / kernel_sum);

            phase.quad += phase_inc.quad;

            ADD_HI(in, phase);

            CLEAR_HI(phase);
        }
        while ( in < in_end );

        r->phase = phase;
        *out_ = out;

        used = (int)(in - in_);

        r->write_filled -= used;
    }

    return used;
}